

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

Hash Fossilize::Hashing::compute_hash_application_info(VkApplicationInfo *info)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)info->pApplicationName;
  uVar2 = ((((ulong)info->applicationVersion ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
           (ulong)info->apiVersion) * 0x100000001b3 ^ (ulong)info->engineVersion) * 0x100000001b3;
  if (pbVar3 != (byte *)0x0) {
    uVar2 = uVar2 ^ 0xff;
    bVar1 = *pbVar3;
    while (bVar1 != 0) {
      pbVar3 = pbVar3 + 1;
      uVar2 = uVar2 * 0x100000001b3 ^ (ulong)bVar1;
      bVar1 = *pbVar3;
    }
  }
  pbVar3 = (byte *)info->pEngineName;
  uVar2 = uVar2 * 0x100000001b3;
  if (pbVar3 != (byte *)0x0) {
    uVar2 = uVar2 ^ 0xff;
    bVar1 = *pbVar3;
    while (bVar1 != 0) {
      pbVar3 = pbVar3 + 1;
      uVar2 = uVar2 * 0x100000001b3 ^ (ulong)bVar1;
      bVar1 = *pbVar3;
    }
  }
  return uVar2;
}

Assistant:

static Hash compute_hash_application_info(const VkApplicationInfo &info)
{
	Hasher h;
	h.u32(info.applicationVersion);
	h.u32(info.apiVersion);
	h.u32(info.engineVersion);

	if (info.pApplicationName)
		h.string(info.pApplicationName);
	else
		h.u32(0);

	if (info.pEngineName)
		h.string(info.pEngineName);
	else
		h.u32(0);

	return h.get();
}